

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

uint nullcGetCurrentExecutor(void **exec)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  if (exec != (void **)0x0) {
    pvVar1 = NULLC::executorX86;
    if (NULLC::currExec != 1) {
      puVar2 = &NULLC::executorRegVm;
      if (NULLC::currExec == 2) {
        puVar2 = &NULLC::executorLLVM;
      }
      pvVar1 = (void *)*puVar2;
    }
    *exec = pvVar1;
  }
  return NULLC::currExec;
}

Assistant:

unsigned int nullcGetCurrentExecutor(void **exec)
{
	using namespace NULLC;

#if !defined(NULLC_NO_EXECUTOR)
	if(exec)
		*exec = currExec == NULLC_X86 ? (void*)executorX86 : (currExec == NULLC_LLVM ? (void*)executorLLVM : (void*)executorRegVm);
#else
	*exec = NULL;
#endif

	return currExec;
}